

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  
  pIVar2 = GImGui;
  if (layer == ImGuiNavLayer_Main) {
    pIVar1 = GImGui->NavWindow;
    pIVar3 = pIVar1->NavLastChildNavWindow;
    if ((pIVar3 == (ImGuiWindow *)0x0) || (pIVar3->WasActive == false)) {
      pIVar3 = pIVar1;
    }
    GImGui->NavWindow = pIVar3;
    pIVar2->NavLastValidSelectionUserData = -1;
    if ((pIVar2->DebugLogFlags & 2) != 0) {
      DebugLog("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n",pIVar1->Name,
               pIVar3->Name);
    }
  }
  pIVar1 = pIVar2->NavWindow;
  if (pIVar1->NavLastIds[layer] != 0) {
    SetNavID(pIVar1->NavLastIds[layer],layer,0,pIVar1->NavRectRel + layer);
    return;
  }
  pIVar2->NavLayer = layer;
  NavInitWindow(pIVar1,true);
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
    {
        ImGuiWindow* prev_nav_window = g.NavWindow;
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);    // FIXME-NAV: Should clear ongoing nav requests?
        g.NavLastValidSelectionUserData = ImGuiSelectionUserData_Invalid;
        if (prev_nav_window)
            IMGUI_DEBUG_LOG_FOCUS("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n", prev_nav_window->Name, g.NavWindow->Name);
    }
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
}